

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFileSpecObjectHelper.cc
# Opt level: O2

string * __thiscall
QPDFFileSpecObjectHelper::getFilename_abi_cxx11_
          (string *__return_storage_ptr__,QPDFFileSpecObjectHelper *this)

{
  pointer pbVar1;
  bool bVar2;
  pointer pbVar3;
  QPDFObjectHandle k;
  QPDFObjectHandle local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  pbVar1 = name_keys_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = name_keys_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pbVar3 == pbVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_50);
      return __return_storage_ptr__;
    }
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_QPDFObjectHelper).super_BaseHandle);
    QPDFObjectHandle::getKey(&local_50,(string *)&stack0xffffffffffffffc0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    bVar2 = QPDFObjectHandle::isString(&local_50);
    if (bVar2) break;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    pbVar3 = pbVar3 + 1;
  }
  QPDFObjectHandle::getUTF8Value_abi_cxx11_(__return_storage_ptr__,&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFFileSpecObjectHelper::getFilename()
{
    for (auto const& i: name_keys) {
        auto k = oh().getKey(i);
        if (k.isString()) {
            return k.getUTF8Value();
        }
    }
    return "";
}